

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindow::updateNormalGeometry(QWidgetWindow *this)

{
  QRect *pQVar1;
  long lVar2;
  long lVar3;
  WindowStates WVar4;
  long *plVar5;
  Representation RVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  QRect local_48;
  long local_38;
  
  QVar8._8_8_ = local_48._8_8_;
  QVar8._0_8_ = local_48._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(*(long *)((this->m_widget).wp.value + 8) + 0x78);
  if ((lVar2 != 0) && (lVar2 = *(long *)(lVar2 + 8), local_48 = QVar8, lVar2 != 0)) {
    plVar5 = (long *)QWindow::handle();
    if (plVar5 == (long *)0x0) {
      QVar8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      uVar7 = 0;
    }
    else {
      local_48 = (QRect)(**(code **)(*plVar5 + 0x38))(plVar5);
      QVar8 = QHighDpi::fromNativePixels<QRect,QWidgetWindow>(&local_48,this);
      uVar7 = QVar8._0_8_ >> 0x20;
    }
    RVar6 = QVar8.y2.m_i;
    if (QVar8.x2.m_i.m_i < QVar8.x1.m_i.m_i || RVar6.m_i < (int)uVar7) {
      WVar4 = QWidget::windowState((QWidget *)(this->m_widget).wp.value);
      if (((uint)WVar4.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7) == 0) {
        lVar3 = *(long *)((this->m_widget).wp.value + 0x20);
        pQVar1 = (QRect *)(lVar3 + 0x14);
        uVar7._0_4_ = pQVar1->x1;
        uVar7._4_4_ = pQVar1->y1;
        QVar8 = *pQVar1;
        uVar7 = uVar7 >> 0x20;
        RVar6.m_i = (int)((ulong)*(undefined8 *)(lVar3 + 0x1c) >> 0x20);
      }
    }
    if ((QVar8.x1.m_i.m_i <= QVar8.x2.m_i.m_i) && ((int)uVar7 <= RVar6.m_i)) {
      *(ulong *)(lVar2 + 0xa0) = QVar8._0_8_ & 0xffffffff | uVar7 << 0x20;
      *(long *)(lVar2 + 0xa8) = QVar8._8_8_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::updateNormalGeometry()
{
    QTLWExtra *tle = m_widget->d_func()->maybeTopData();
    if (!tle)
        return;
     // Ask platform window, default to widget geometry.
    QRect normalGeometry;
    if (const QPlatformWindow *pw = handle())
        normalGeometry = QHighDpi::fromNativePixels(pw->normalGeometry(), this);
    if (!normalGeometry.isValid() && !(m_widget->windowState() & ~Qt::WindowActive))
        normalGeometry = m_widget->geometry();
    if (normalGeometry.isValid())
        tle->normalGeometry = normalGeometry;
}